

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int g_read(lua_State *L,FILE *f,int first)

{
  char cVar1;
  StkId pTVar2;
  int iVar3;
  uint uVar4;
  size_t n;
  char *pcVar5;
  StkId pTVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  Value local_38;
  
  pTVar6 = L->top;
  pTVar2 = L->base;
  clearerr((FILE *)f);
  iVar7 = (int)((ulong)((long)pTVar6 - (long)pTVar2) >> 4);
  iVar8 = iVar7 + -1;
  if (iVar8 == 0) {
    uVar4 = read_line(L,f);
    iVar7 = first + 1;
  }
  else {
    luaL_checkstack(L,iVar7 + 0x13,"too many arguments");
    uVar4 = 1;
    iVar7 = first;
    while ((bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9 && (uVar4 != 0))) {
      iVar3 = lua_type(L,iVar7);
      if (iVar3 == 3) {
        n = lua_tointeger(L,iVar7);
        if (n == 0) {
          iVar3 = getc((FILE *)f);
          ungetc(iVar3,(FILE *)f);
          lua_pushlstring(L,(char *)0x0,0);
          uVar4 = (uint)(iVar3 != -1);
        }
        else {
          uVar4 = read_chars(L,f,n);
        }
      }
      else {
        pcVar5 = lua_tolstring(L,iVar7,(size_t *)0x0);
        if ((pcVar5 == (char *)0x0) || (*pcVar5 != '*')) {
          pcVar5 = "invalid option";
LAB_0010f586:
          luaL_argerror(L,iVar7,pcVar5);
        }
        cVar1 = pcVar5[1];
        if (cVar1 == 'a') {
          read_chars(L,f,0xffffffffffffffff);
          uVar4 = 1;
        }
        else if (cVar1 == 'l') {
          uVar4 = read_line(L,f);
        }
        else {
          if (cVar1 != 'n') {
            pcVar5 = "invalid format";
            goto LAB_0010f586;
          }
          iVar3 = __isoc99_fscanf(f,"%lf",&local_38);
          if (iVar3 != 1) {
            pTVar6 = L->top;
            pTVar6->tt = 0;
          }
          else {
            pTVar6 = L->top;
            pTVar6->value = local_38;
            pTVar6->tt = 3;
            pTVar6 = L->top;
          }
          uVar4 = (uint)(iVar3 == 1);
          L->top = pTVar6 + 1;
        }
      }
      iVar7 = iVar7 + 1;
    }
  }
  iVar8 = ferror((FILE *)f);
  if (iVar8 == 0) {
    if (uVar4 == 0) {
      pTVar6 = L->top;
      pTVar6[-1].tt = 0;
      L->top = pTVar6;
    }
    iVar7 = iVar7 - first;
  }
  else {
    iVar7 = pushresult(L,0,(char *)0x0);
  }
  return iVar7;
}

Assistant:

static int g_read(lua_State*L,FILE*f,int first){
int nargs=lua_gettop(L)-1;
int success;
int n;
clearerr(f);
if(nargs==0){
success=read_line(L,f);
n=first+1;
}
else{
luaL_checkstack(L,nargs+20,"too many arguments");
success=1;
for(n=first;nargs--&&success;n++){
if(lua_type(L,n)==3){
size_t l=(size_t)lua_tointeger(L,n);
success=(l==0)?test_eof(L,f):read_chars(L,f,l);
}
else{
const char*p=lua_tostring(L,n);
luaL_argcheck(L,p&&p[0]=='*',n,"invalid option");
switch(p[1]){
case'n':
success=read_number(L,f);
break;
case'l':
success=read_line(L,f);
break;
case'a':
read_chars(L,f,~((size_t)0));
success=1;
break;
default:
return luaL_argerror(L,n,"invalid format");
}
}
}
}
if(ferror(f))
return pushresult(L,0,NULL);
if(!success){
lua_pop(L,1);
lua_pushnil(L);
}
return n-first;
}